

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_do_more(Curl_easy *data,int *completep)

{
  byte *pbVar1;
  uint uVar2;
  connectdata *conn;
  FTP *pFVar3;
  curl_trc_feat *pcVar4;
  ftpstate newstate;
  _Bool _Var5;
  CURLcode CVar6;
  ulong in_RAX;
  char *pcVar7;
  uint5 uStack_38;
  _Bool complete;
  _Bool serv_conned;
  _Bool connected;
  
  conn = data->conn;
  _uStack_38 = in_RAX & 0xffffffffffffff;
  _uStack_38 = (uint6)uStack_38;
  if (conn->cfilter[1] != (Curl_cfilter *)0x0) {
    CVar6 = Curl_conn_connect(data,1,false,&connected);
    if (CVar6 != CURLE_OK) {
      if ((conn->proto).ftpc.count1 != 0) {
        return CVar6;
      }
      *completep = -1;
      CVar6 = ftp_epsv_disable(data,conn);
      return CVar6;
    }
    _Var5 = Curl_conn_is_ip_connected(data,1);
    if (!_Var5) {
      return CURLE_OK;
    }
  }
  pFVar3 = (data->req).p.ftp;
  if ((conn->proto).ftpc.state != '\0') {
    CVar6 = ftp_multi_statemach(data,&complete);
    *completep = (uint)complete;
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
    if ((*(byte *)((long)&conn->proto + 0x112) & 0x20) == 0) {
      return CURLE_OK;
    }
    *completep = 0;
  }
  if (PPTRANSFER_INFO < pFVar3->transfer) {
    Curl_xfer_setup_nop(data);
    if ((*(byte *)((long)&conn->proto + 0x112) & 0x20) != 0) {
      return CURLE_OK;
    }
    *completep = 1;
    if (((data->set).field_0x8cd & 0x10) == 0) {
      return CURLE_OK;
    }
    pcVar4 = (data->state).feat;
    if ((pcVar4 != (curl_trc_feat *)0x0) && (pcVar4->log_level < 1)) {
      return CURLE_OK;
    }
    if (Curl_trc_feat_ftp.log_level < 1) {
      return CURLE_OK;
    }
    if (data->conn == (connectdata *)0x0) {
      pcVar7 = "???";
    }
    else {
      pcVar7 = ftp_state_names[(data->conn->proto).ftpc.state];
    }
    Curl_trc_ftp(data,"[%s] DO-MORE phase ends with %d",pcVar7,0);
    return CURLE_OK;
  }
  if ((*(byte *)((long)&conn->proto + 0x112) & 0x20) != 0) {
    CVar6 = ReceivedServerConnect(data,&serv_conned);
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
    if (serv_conned == true) {
      CVar6 = AcceptServerConnect(data);
      pbVar1 = (byte *)((long)&conn->proto + 0x112);
      *pbVar1 = *pbVar1 & 0xdf;
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      CVar6 = InitiateTransfer(data);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      *completep = 1;
    }
    return CURLE_OK;
  }
  uVar2 = *(uint *)&(data->state).field_0x774;
  if ((uVar2 >> 0x11 & 1) == 0) {
    pFVar3->downloadsize = -1;
    CVar6 = Curl_range(data);
    if (CVar6 != CURLE_OK) goto LAB_001272b9;
    if (-1 < (data->req).maxdownload) {
      pbVar1 = (byte *)((long)&conn->proto + 0x112);
      *pbVar1 = *pbVar1 | 2;
    }
    uVar2 = *(uint *)&(data->state).field_0x774;
    if (((uVar2 >> 0xd & 1) == 0) && ((conn->proto).ftpc.file != (char *)0x0)) {
      _Var5 = (_Bool)((byte)(uVar2 >> 0xc) & 1);
      newstate = '\x15';
    }
    else {
      if (pFVar3->transfer != PPTRANSFER_BODY) goto LAB_001272b9;
      _Var5 = true;
      newstate = '\x14';
    }
  }
  else {
    _Var5 = (_Bool)((byte)(uVar2 >> 0xc) & 1);
    newstate = '\x16';
  }
  CVar6 = ftp_nb_type(data,conn,_Var5,newstate);
  if (CVar6 != CURLE_OK) {
    return CVar6;
  }
LAB_001272b9:
  CVar6 = ftp_multi_statemach(data,&complete);
  *completep = (uint)complete;
  return CVar6;
}

Assistant:

static CURLcode ftp_do_more(struct Curl_easy *data, int *completep)
{
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result = CURLE_OK;
  bool connected = FALSE;
  bool complete = FALSE;

  /* the ftp struct is inited in ftp_connect(). If we are connecting to an HTTP
   * proxy then the state will not be valid until after that connection is
   * complete */
  struct FTP *ftp = NULL;

  /* if the second connection is not done yet, wait for it to have
   * connected to the remote host. When using proxy tunneling, this
   * means the tunnel needs to have been establish. However, we
   * can not expect the remote host to talk to us in any way yet.
   * So, when using ftps: the SSL handshake will not start until we
   * tell the remote server that we are there. */
  if(conn->cfilter[SECONDARYSOCKET]) {
    result = Curl_conn_connect(data, SECONDARYSOCKET, FALSE, &connected);
    if(result || !Curl_conn_is_ip_connected(data, SECONDARYSOCKET)) {
      if(result && (ftpc->count1 == 0)) {
        *completep = -1; /* go back to DOING please */
        /* this is a EPSV connect failing, try PASV instead */
        return ftp_epsv_disable(data, conn);
      }
      return result;
    }
  }

  /* Curl_proxy_connect might have moved the protocol state */
  ftp = data->req.p.ftp;

  if(ftpc->state) {
    /* already in a state so skip the initial commands.
       They are only done to kickstart the do_more state */
    result = ftp_multi_statemach(data, &complete);

    *completep = (int)complete;

    /* if we got an error or if we do not wait for a data connection return
       immediately */
    if(result || !ftpc->wait_data_conn)
      return result;

    /* if we reach the end of the FTP state machine here, *complete will be
       TRUE but so is ftpc->wait_data_conn, which says we need to wait for the
       data connection and therefore we are not actually complete */
    *completep = 0;
  }

  if(ftp->transfer <= PPTRANSFER_INFO) {
    /* a transfer is about to take place, or if not a filename was given so we
       will do a SIZE on it later and then we need the right TYPE first */

    if(ftpc->wait_data_conn) {
      bool serv_conned;

      result = ReceivedServerConnect(data, &serv_conned);
      if(result)
        return result; /* Failed to accept data connection */

      if(serv_conned) {
        /* It looks data connection is established */
        result = AcceptServerConnect(data);
        ftpc->wait_data_conn = FALSE;
        if(!result)
          result = InitiateTransfer(data);

        if(result)
          return result;

        *completep = 1; /* this state is now complete when the server has
                           connected back to us */
      }
    }
    else if(data->state.upload) {
      result = ftp_nb_type(data, conn, data->state.prefer_ascii,
                           FTP_STOR_TYPE);
      if(result)
        return result;

      result = ftp_multi_statemach(data, &complete);
      *completep = (int)complete;
    }
    else {
      /* download */
      ftp->downloadsize = -1; /* unknown as of yet */

      result = Curl_range(data);

      if(result == CURLE_OK && data->req.maxdownload >= 0) {
        /* Do not check for successful transfer */
        ftpc->dont_check = TRUE;
      }

      if(result)
        ;
      else if(data->state.list_only || !ftpc->file) {
        /* The specified path ends with a slash, and therefore we think this
           is a directory that is requested, use LIST. But before that we
           need to set ASCII transfer mode. */

        /* But only if a body transfer was requested. */
        if(ftp->transfer == PPTRANSFER_BODY) {
          result = ftp_nb_type(data, conn, TRUE, FTP_LIST_TYPE);
          if(result)
            return result;
        }
        /* otherwise just fall through */
      }
      else {
        result = ftp_nb_type(data, conn, data->state.prefer_ascii,
                             FTP_RETR_TYPE);
        if(result)
          return result;
      }

      result = ftp_multi_statemach(data, &complete);
      *completep = (int)complete;
    }
    return result;
  }

  /* no data to transfer */
  Curl_xfer_setup_nop(data);

  if(!ftpc->wait_data_conn) {
    /* no waiting for the data connection so this is now complete */
    *completep = 1;
    CURL_TRC_FTP(data, "[%s] DO-MORE phase ends with %d", FTP_DSTATE(data),
                 (int)result);
  }

  return result;
}